

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void unparsedEntityDeclSplit
               (void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId,xmlChar *notationName)

{
  xmlSchemaSAXPlugPtr ctxt;
  xmlChar *notationName_local;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  xmlChar *name_local;
  void *ctx_local;
  
  if (((ctx != (void *)0x0) && (*(long *)((long)ctx + 0x10) != 0)) &&
     (*(long *)(*(long *)((long)ctx + 0x10) + 0x50) != 0)) {
    (**(code **)(*(long *)((long)ctx + 0x10) + 0x50))
              (*(undefined8 *)((long)ctx + 0x20),name,publicId,systemId,notationName);
  }
  return;
}

Assistant:

static void
unparsedEntityDeclSplit(void *ctx, const xmlChar *name,
		   const xmlChar *publicId, const xmlChar *systemId,
		   const xmlChar *notationName)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if ((ctxt != NULL) && (ctxt->user_sax != NULL) &&
        (ctxt->user_sax->unparsedEntityDecl != NULL))
	ctxt->user_sax->unparsedEntityDecl(ctxt->user_data, name, publicId,
	                                   systemId, notationName);
}